

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

JavascriptFunction * __thiscall
Js::JavascriptLibrary::EnsureAsyncGeneratorNextFunction(JavascriptLibrary *this)

{
  Type *addr;
  RuntimeFunction *pRVar1;
  
  addr = &this->asyncGeneratorNextFunction;
  if ((this->asyncGeneratorNextFunction).ptr == (JavascriptFunction *)0x0) {
    pRVar1 = DefaultCreateFunction
                       (this,(FunctionInfo *)JavascriptAsyncGenerator::EntryInfo::Next,1,
                        (DynamicObject *)0x0,(DynamicType *)0x0,0x107);
    Memory::Recycler::WBSetBit((char *)addr);
    (this->asyncGeneratorNextFunction).ptr = &pRVar1->super_JavascriptFunction;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  return addr->ptr;
}

Assistant:

JavascriptFunction* JavascriptLibrary::EnsureAsyncGeneratorNextFunction()
    {
        if (asyncGeneratorNextFunction == nullptr)
        {
            asyncGeneratorNextFunction = DefaultCreateFunction(&JavascriptAsyncGenerator::EntryInfo::Next, 1, nullptr, nullptr, PropertyIds::next);
        }
        return asyncGeneratorNextFunction;
    }